

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeSolution(Highs *this,string *filename,HighsInt style)

{
  HighsModel *model;
  bool bVar1;
  __type _Var2;
  HighsStatus HVar3;
  HighsStatus call_status;
  FILE *__s;
  Highs *this_00;
  Highs *pHVar4;
  int style_00;
  allocator local_179;
  FILE *file;
  HighsBasis *local_170;
  ulong local_168;
  string local_160;
  HighsSolution *local_140;
  HighsFileType file_type;
  string local_130;
  string local_110;
  undefined1 local_f0 [96];
  HighsLogOptions local_90;
  
  std::__cxx11::string::string((string *)&local_110,(string *)filename);
  std::__cxx11::string::string((string *)&local_130,"writeSolution",(allocator *)&local_160);
  HVar3 = openWriteFile(this,&local_110,&local_130,&file,&file_type);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  pHVar4 = (Highs *)&(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_90,(HighsLogOptions *)pHVar4);
  std::__cxx11::string::string((string *)&local_160,"openWriteFile",&local_179);
  HVar3 = interpretCallStatus(&local_90,HVar3,kOk,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  if (HVar3 == kError) {
    return kError;
  }
  local_168 = (ulong)(uint)style;
  bVar1 = std::operator!=(filename,"");
  if (bVar1) {
    highsLogUser((HighsLogOptions *)pHVar4,kInfo,"Writing the solution to %s\n",
                 (filename->_M_dataplus)._M_p);
  }
  __s = file;
  model = &this->model_;
  local_170 = &this->basis_;
  local_140 = &this->solution_;
  style_00 = (int)local_168;
  this_00 = (Highs *)file;
  writeSolutionFile(file,&this->options_,model,local_170,local_140,&this->info_,this->model_status_,
                    style_00);
  if (style_00 == 0) {
    fwrite("\n# Basis\n",9,1,(FILE *)__s);
    writeBasisFile(&file,local_170);
  }
  else if (style_00 == 4) goto LAB_0023b1fb;
  this_00 = (Highs *)&(this->options_).super_HighsOptionsStruct.ranging;
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,&::kHighsOnString_abi_cxx11_);
  __s = file;
  if (_Var2) {
    bVar1 = HighsLp::isMip(&model->lp_);
    if ((bVar1) || ((this->model_).hessian_.dim_ != 0)) {
      highsLogUser((HighsLogOptions *)pHVar4,kError,
                   "Cannot determine ranging information for MIP or QP\n");
      HVar3 = kError;
      __s = file;
      this_00 = pHVar4;
    }
    else {
      HighsLogOptions::HighsLogOptions((HighsLogOptions *)local_f0,(HighsLogOptions *)pHVar4);
      call_status = getRangingInterface(this);
      std::__cxx11::string::string((string *)&local_160,"getRangingInterface",&local_179);
      HVar3 = interpretCallStatus((HighsLogOptions *)local_f0,call_status,HVar3,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      pHVar4 = (Highs *)(local_f0 + 0x30);
      std::_Function_base::~_Function_base((_Function_base *)pHVar4);
      if (HVar3 == kError) {
        returnFromWriteSolution(pHVar4,file,kError);
      }
      fwrite("\n# Ranging\n",0xb,1,(FILE *)file);
      this_00 = (Highs *)file;
      writeRangingFile(file,&model->lp_,(this->info_).super_HighsInfoStruct.objective_function_value
                       ,local_170,local_140,&this->ranging_,(HighsInt)local_168);
      __s = file;
    }
  }
LAB_0023b1fb:
  returnFromWriteSolution(this_00,__s,HVar3);
  return HVar3;
}

Assistant:

HighsStatus Highs::writeSolution(const std::string& filename,
                                 const HighsInt style) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writeSolution", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that solution is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the solution to %s\n", filename.c_str());
  writeSolutionFile(file, options_, model_, basis_, solution_, info_,
                    model_status_, style);
  if (style == kSolutionStyleSparse)
    return returnFromWriteSolution(file, return_status);
  if (style == kSolutionStyleRaw) {
    fprintf(file, "\n# Basis\n");
    writeBasisFile(file, basis_);
  }
  if (options_.ranging == kHighsOnString) {
    if (model_.isMip() || model_.isQp()) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot determine ranging information for MIP or QP\n");
      return_status = HighsStatus::kError;
      return returnFromWriteSolution(file, return_status);
    }
    return_status =
        interpretCallStatus(options_.log_options, this->getRangingInterface(),
                            return_status, "getRangingInterface");
    if (return_status == HighsStatus::kError)
      returnFromWriteSolution(file, return_status);
    fprintf(file, "\n# Ranging\n");
    writeRangingFile(file, model_.lp_, info_.objective_function_value, basis_,
                     solution_, ranging_, style);
  }
  return returnFromWriteSolution(file, return_status);
}